

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_top_p_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float *pfVar1;
  llama_token_data_array *in_RSI;
  long in_RDI;
  size_t i;
  size_t last_idx;
  float cum_sum;
  llama_sampler_top_p *ctx;
  ulong local_30;
  size_t local_28;
  float local_1c;
  
  pfVar1 = *(float **)(in_RDI + 8);
  if (*pfVar1 < 1.0) {
    llama_sampler_softmax_impl(in_RSI);
    local_1c = 0.0;
    local_28 = in_RSI->size;
    for (local_30 = 0; local_30 < in_RSI->size; local_30 = local_30 + 1) {
      local_1c = in_RSI->data[local_30].p + local_1c;
      if ((*pfVar1 <= local_1c) && (*(ulong *)(pfVar1 + 2) <= local_30 + 1)) {
        local_28 = local_30 + 1;
        break;
      }
    }
    in_RSI->size = local_28;
  }
  return;
}

Assistant:

static void llama_sampler_top_p_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_top_p *) smpl->ctx;

    if (ctx->p >= 1.0f) {
        return;
    }

    llama_sampler_softmax_impl(cur_p);

    // Compute the cumulative probabilities
    float cum_sum = 0.0f;
    size_t last_idx = cur_p->size;

    for (size_t i = 0; i < cur_p->size; ++i) {
        cum_sum += cur_p->data[i].p;

        // Check if the running sum is at least p or if we have kept at least min_keep tokens
        // we set the last index to i+1 to indicate that the current iterate should be included in the set
        if (cum_sum >= ctx->p && i + 1 >= ctx->min_keep) {
            last_idx = i + 1;
            break;
        }
    }

    // Resize the output vector to keep only the top-p tokens
    cur_p->size = last_idx;
}